

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O0

bool __thiscall
DynamicProfileStorageReaderWriter::ReadUtf8String
          (DynamicProfileStorageReaderWriter *this,char16 **str,DWORD *len)

{
  bool bVar1;
  Memory *pMVar2;
  TrackAllocData local_a8;
  char16_t *local_80;
  char16 *name;
  code *pcStack_70;
  charcount_t length;
  undefined8 local_68;
  TrackAllocData local_60;
  uchar *local_38;
  utf8char_t *tempBuffer;
  DWORD *pDStack_28;
  DWORD urllen;
  DWORD *len_local;
  char16 **str_local;
  DynamicProfileStorageReaderWriter *this_local;
  
  pDStack_28 = len;
  len_local = (DWORD *)str;
  str_local = &this->filename;
  bVar1 = Read<unsigned_int>(this,(uint *)((long)&tempBuffer + 4));
  if (bVar1) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&unsigned_char::typeinfo,0,(ulong)tempBuffer._4_4_,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
               ,0x70);
    pMVar2 = (Memory *)
             Memory::NoCheckHeapAllocator::TrackAllocInfo
                       ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,&local_60);
    pcStack_70 = Memory::NoCheckHeapAllocator::Alloc;
    local_68 = 0;
    local_38 = Memory::AllocateArray<Memory::NoCheckHeapAllocator,unsigned_char,false>
                         (pMVar2,(NoCheckHeapAllocator *)Memory::NoCheckHeapAllocator::Alloc,0,
                          (ulong)tempBuffer._4_4_);
    if (local_38 == (uchar *)0x0) {
      Output::Print(L"ERROR: DynamicProfileStorage: Out of memory reading \'%s\'\n",this->filename);
      Output::Flush();
      this_local._7_1_ = false;
    }
    else {
      bVar1 = ReadArray<unsigned_char>(this,local_38,(ulong)tempBuffer._4_4_);
      if (bVar1) {
        name._4_4_ = utf8::ByteIndexIntoCharacterIndex(local_38,(ulong)tempBuffer._4_4_,doDefault);
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_a8,(type_info *)&char16_t::typeinfo,0,(ulong)(name._4_4_ + 1),
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                   ,0x7f);
        pMVar2 = (Memory *)
                 Memory::NoCheckHeapAllocator::TrackAllocInfo
                           ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,
                            &local_a8);
        local_80 = Memory::AllocateArray<Memory::NoCheckHeapAllocator,char16_t,false>
                             (pMVar2,(NoCheckHeapAllocator *)Memory::NoCheckHeapAllocator::Alloc,0,
                              (ulong)(name._4_4_ + 1));
        if (local_80 == (char16_t *)0x0) {
          Output::Print(L"ERROR: DynamicProfileStorage: Out of memory reading \'%s\'\n",
                        this->filename);
          Output::Flush();
          Memory::DeleteArray<Memory::HeapAllocator,unsigned_char>
                    (&Memory::HeapAllocator::Instance,(ulong)tempBuffer._4_4_,local_38);
          this_local._7_1_ = false;
        }
        else {
          utf8::DecodeUnitsIntoAndNullTerminateNoAdvance
                    (local_80,local_38,local_38 + tempBuffer._4_4_,doDefault,(bool *)0x0);
          Memory::DeleteArray<Memory::NoCheckHeapAllocator,unsigned_char>
                    ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,
                     (ulong)tempBuffer._4_4_,local_38);
          *(char16_t **)len_local = local_80;
          *pDStack_28 = name._4_4_;
          this_local._7_1_ = true;
        }
      }
      else {
        Memory::DeleteArray<Memory::HeapAllocator,unsigned_char>
                  (&Memory::HeapAllocator::Instance,(ulong)tempBuffer._4_4_,local_38);
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DynamicProfileStorageReaderWriter::ReadUtf8String(__deref_out_z char16 ** str, __out DWORD * len)
{
    DWORD urllen;
    if (!Read(&urllen))
    {
        return false;
    }

    utf8char_t* tempBuffer = NoCheckHeapNewArray(utf8char_t, urllen);
    if (tempBuffer == nullptr)
    {
        Output::Print(_u("ERROR: DynamicProfileStorage: Out of memory reading '%s'\n"), filename);
        Output::Flush();
        return false;
    }

    if (!ReadArray(tempBuffer, urllen))
    {
        HeapDeleteArray(urllen, tempBuffer);
        return false;
    }

    charcount_t length = utf8::ByteIndexIntoCharacterIndex(tempBuffer, urllen);
    char16 * name = NoCheckHeapNewArray(char16, length + 1);
    if (name == nullptr)
    {
        Output::Print(_u("ERROR: DynamicProfileStorage: Out of memory reading '%s'\n"), filename);
        Output::Flush();
        HeapDeleteArray(urllen, tempBuffer);
        return false;
    }
    utf8::DecodeUnitsIntoAndNullTerminateNoAdvance(name, tempBuffer, tempBuffer + urllen);
    NoCheckHeapDeleteArray(urllen, tempBuffer);
    *str = name;
    *len = length;
    return true;
}